

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O1

void __thiscall
cfd::js::api::json::PsbtInputRequestData::ConvertFromStruct
          (PsbtInputRequestData *this,PsbtInputRequestDataStruct *data)

{
  std::__cxx11::string::_M_assign((string *)&this->utxo_full_tx_);
  TxOutRequest::ConvertFromStruct(&this->witness_utxo_,&data->witness_utxo);
  std::__cxx11::string::_M_assign((string *)&this->redeem_script_);
  core::
  JsonObjectVector<cfd::js::api::json::PsbtBip32PubkeyInput,_cfd::js::api::PsbtBip32PubkeyInputStruct>
  ::ConvertFromStruct(&this->bip32_derives_,&data->bip32_derives);
  std::__cxx11::string::_M_assign((string *)&this->sighash_);
  core::
  JsonObjectVector<cfd::js::api::json::PsbtSignatureData,_cfd::js::api::PsbtSignatureDataStruct>::
  ConvertFromStruct(&this->partial_signature_,&data->partial_signature);
  core::JsonObjectVector<cfd::js::api::json::PsbtMapData,_cfd::js::api::PsbtMapDataStruct>::
  ConvertFromStruct(&this->unknown_,&data->unknown);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->ignore_items)._M_t,&(data->ignore_items)._M_t);
  return;
}

Assistant:

void PsbtInputRequestData::ConvertFromStruct(
    const PsbtInputRequestDataStruct& data) {
  utxo_full_tx_ = data.utxo_full_tx;
  witness_utxo_.ConvertFromStruct(data.witness_utxo);
  redeem_script_ = data.redeem_script;
  bip32_derives_.ConvertFromStruct(data.bip32_derives);
  sighash_ = data.sighash;
  partial_signature_.ConvertFromStruct(data.partial_signature);
  unknown_.ConvertFromStruct(data.unknown);
  ignore_items = data.ignore_items;
}